

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O2

void __thiscall
CLIntercept::getMDAPICountersFromEvent(CLIntercept *this,string *name,cl_event event)

{
  uint32_t uVar1;
  cl_int e;
  char *pReportData;
  float __x;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  results;
  vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
  ioInfoValues;
  cl_command_type type;
  uint uStack_54;
  pointer pSStack_50;
  pointer local_48;
  size_t outputSize;
  
  if (this->m_pMDHelper != (MDHelper *)0x0) {
    uVar1 = MetricsDiscovery::MDHelper::GetQueryReportSize(this->m_pMDHelper);
    pReportData = (char *)operator_new__((ulong)uVar1);
    outputSize = 0;
    e = (*(this->m_Dispatch).clGetEventProfilingInfo)
                  (event,0x407f,(ulong)uVar1,pReportData,&outputSize);
    if (e == 0) {
      results.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      results.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      results.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      _type = (pointer)0x0;
      pSStack_50 = (pointer)0x0;
      local_48 = (pointer)0x0;
      ioInfoValues.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ioInfoValues.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ioInfoValues.
      super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar1 = MetricsDiscovery::MDHelper::GetMetricsFromReports
                        (this->m_pMDHelper,1,pReportData,&results,
                         (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                          *)&type);
      if (uVar1 != 0) {
        MetricsDiscovery::MDHelper::PrintMetricValues
                  (this->m_pMDHelper,(ostream *)&this->m_MetricDump,name,uVar1,&results,
                   (vector<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                    *)&type,&ioInfoValues);
        MetricsDiscovery::MDHelper::AggregateMetrics
                  (this->m_pMDHelper,&this->m_MetricAggregations,name,&results);
      }
      std::
      _Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ::~_Vector_base(&ioInfoValues.
                       super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                     );
      std::
      _Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ::~_Vector_base((_Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                       *)&type);
      std::
      _Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
      ::~_Vector_base(&results.
                       super__Vector_base<MetricsDiscovery::STypedValue_1_0,_std::allocator<MetricsDiscovery::STypedValue_1_0>_>
                     );
    }
    else {
      _type = (pointer)((ulong)uStack_54 << 0x20);
      (*(this->m_Dispatch).clGetEventInfo)(event,0x11d1,4,&type,(size_t *)0x0);
      if (type == 0x11f0) {
        CEnumNameMap::name_abi_cxx11_((string *)&results,&this->m_EnumNameMap,e);
        logf(this,__x);
        std::__cxx11::string::~string((string *)&results);
      }
    }
    operator_delete__(pReportData);
  }
  return;
}

Assistant:

void CLIntercept::getMDAPICountersFromEvent(
    const std::string& name,
    const cl_event event )
{
    // We should only get here when event based sampling is enabled.
    CLI_ASSERT( config().DevicePerfCounterEventBasedSampling );

    if( m_pMDHelper )
    {
        const size_t reportSize = m_pMDHelper->GetQueryReportSize();

        char*   pReport = new char[ reportSize ];
        if( pReport )
        {
            size_t  outputSize = 0;
            cl_int  errorCode = dispatch().clGetEventProfilingInfo(
                event,
                CL_PROFILING_COMMAND_PERFCOUNTERS_INTEL,
                reportSize,
                pReport,
                &outputSize );

            if( errorCode == CL_SUCCESS )
            {
                // Check: The size of the queried report should be the expected size.
                CLI_ASSERT( outputSize == reportSize );

                std::vector<MetricsDiscovery::TTypedValue_1_0> results;
                std::vector<MetricsDiscovery::TTypedValue_1_0> maxValues;
                std::vector<MetricsDiscovery::TTypedValue_1_0> ioInfoValues; // unused

                uint32_t numResults = m_pMDHelper->GetMetricsFromReports(
                    1,
                    pReport,
                    results,
                    maxValues );

                if( numResults )
                {
                    m_pMDHelper->PrintMetricValues(
                        m_MetricDump,
                        name,
                        numResults,
                        results,
                        maxValues,
                        ioInfoValues );
                    m_pMDHelper->AggregateMetrics(
                        m_MetricAggregations,
                        name,
                        results );
                }
            }
            else
            {
                // Currently, MDAPI data is only included for kernels, so only
                // report an errors for kernel events.
                cl_command_type type = 0;
                dispatch().clGetEventInfo(
                    event,
                    CL_EVENT_COMMAND_TYPE,
                    sizeof(type),
                    &type,
                    NULL );
                if( type == CL_COMMAND_NDRANGE_KERNEL )
                {
                    logf("Couldn't get MDAPI data for kernel!  clGetEventProfilingInfo returned '%s' (%08X)!\n",
                        enumName().name(errorCode).c_str(),
                        errorCode );
                }
            }

            delete [] pReport;
            pReport = NULL;
        }
    }
}